

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O0

bool __thiscall CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile(CodeGenWorkItem *this)

{
  SourceDynamicProfileManager *this_00;
  bool bVar1;
  ExecutionFlags EVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  LocalFunctionId functionId;
  FunctionBody *this_01;
  SourceContextInfo *pSVar7;
  SourceDynamicProfileManager **ppSVar8;
  ExecutionFlags executionFlags;
  SourceDynamicProfileManager *profileManager;
  uint straightLineSize;
  uint loopPercentage;
  FunctionBody *functionBody;
  CodeGenWorkItem *this_local;
  
  this_01 = GetFunctionBody(this);
  uVar3 = Js::FunctionBody::GetByteCodeInLoopCount(this_01);
  uVar4 = Js::FunctionBody::GetByteCodeCount(this_01);
  uVar5 = Js::FunctionBody::GetByteCodeCount(this_01);
  uVar6 = Js::FunctionBody::GetByteCodeInLoopCount(this_01);
  if ((0x31 < (uVar3 * 100) / (uVar4 + 1)) || (uVar5 - uVar6 < 300)) {
    pSVar7 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_01);
    ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                        ((WriteBarrierPtr *)&pSVar7->sourceDynamicProfileManager);
    this_00 = *ppSVar8;
    if (this_00 != (SourceDynamicProfileManager *)0x0) {
      Js::FunctionBody::SetIsSpeculativeJitCandidate(this_01);
      bVar1 = Js::FunctionBody::HasDynamicProfileInfo(this_01);
      if (!bVar1) {
        return false;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_01);
      EVar2 = Js::SourceDynamicProfileManager::IsFunctionExecuted(this_00,functionId);
      if (EVar2 == ExecutionFlags_Executed) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile() const
{
    Js::FunctionBody* functionBody = this->GetFunctionBody();

    uint loopPercentage = (functionBody->GetByteCodeInLoopCount()*100) / (functionBody->GetByteCodeCount() + 1);
    uint straightLineSize = functionBody->GetByteCodeCount() - functionBody->GetByteCodeInLoopCount();

    // This ensures only small and loopy functions are prejitted.
    if(loopPercentage >= 50 || straightLineSize < 300)
    {
        Js::SourceDynamicProfileManager* profileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
        if(profileManager != nullptr)
        {
            functionBody->SetIsSpeculativeJitCandidate();

            if(!functionBody->HasDynamicProfileInfo())
            {
                return false;
            }

            Js::ExecutionFlags executionFlags = profileManager->IsFunctionExecuted(functionBody->GetLocalFunctionId());
            if(executionFlags == Js::ExecutionFlags_Executed)
            {
                return true;
            }
        }
    }
    return false;
}